

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch.h
# Opt level: O0

Branch * __thiscall testinator::Branch::pushChild(Branch *this,int line,char *file,char *name)

{
  bool bVar1;
  _Self local_58;
  int local_4c;
  _List_node_base *local_48;
  _List_iterator<testinator::Branch> local_40;
  _Self local_38;
  _List_iterator<testinator::Branch> i;
  char *name_local;
  char *file_local;
  Branch *pBStack_18;
  int line_local;
  Branch *this_local;
  
  i._M_node = (_List_node_base *)name;
  name_local = file;
  file_local._4_4_ = line;
  pBStack_18 = this;
  local_40._M_node =
       (_List_node_base *)
       ::std::__cxx11::list<testinator::Branch,_std::allocator<testinator::Branch>_>::begin
                 (&this->m_children);
  local_48 = (_List_node_base *)
             ::std::__cxx11::list<testinator::Branch,_std::allocator<testinator::Branch>_>::end
                       (&this->m_children);
  local_4c = file_local._4_4_;
  local_38._M_node =
       (_List_node_base *)
       ::std::
       find_if<std::_List_iterator<testinator::Branch>,testinator::Branch::pushChild(int,char_const*,char_const*)::_lambda(testinator::Branch_const&)_1_>
                 (local_40,(_List_iterator<testinator::Branch>)local_48,file_local._4_4_);
  local_58._M_node =
       (_List_node_base *)
       ::std::__cxx11::list<testinator::Branch,_std::allocator<testinator::Branch>_>::end
                 (&this->m_children);
  bVar1 = ::std::operator!=(&local_38,&local_58);
  if (bVar1) {
    this_local = ::std::_List_iterator<testinator::Branch>::operator*(&local_38);
  }
  else {
    ::std::__cxx11::list<testinator::Branch,std::allocator<testinator::Branch>>::
    emplace_back<int&,char_const*&,char_const*&>
              ((list<testinator::Branch,std::allocator<testinator::Branch>> *)&this->m_children,
               (int *)((long)&file_local + 4),&name_local,(char **)&i);
    this_local = ::std::__cxx11::list<testinator::Branch,_std::allocator<testinator::Branch>_>::back
                           (&this->m_children);
  }
  return this_local;
}

Assistant:

Branch& pushChild(int line, const char* file, const char* name)
    {
      auto i = std::find_if(m_children.begin(), m_children.end(),
                            [=] (const Branch& r) { return r.m_id == line; });
      if (i != m_children.end()) return *i;

      m_children.emplace_back(line, file, name);
      return m_children.back();
    }